

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::LTAircraft(LTAircraft *this,LTFlightData *inFd)

{
  posFlagsTy *ppVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  double dVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  FlightModel *pFVar8;
  Doc8643 *pDVar9;
  string *psVar10;
  char *pcVar11;
  long *plVar12;
  recursive_mutex *__mutex;
  long *plVar13;
  XPMPPlaneID _modeS_id;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  allocator<char> local_6db;
  allocator<char> local_6da;
  allocator<char> local_6d9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  dequePositionTy *local_6d0;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  long *local_5c8;
  size_type local_5c0;
  long local_5b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  long *local_588 [2];
  long local_578 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  long *local_548;
  size_type local_540;
  long local_538 [2];
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  FDStaticData statCopy;
  FDDynamicData dynCopy;
  undefined1 local_288 [152];
  _Alloc_hider local_1f0;
  size_type local_1e8;
  FDStaticData local_1c8;
  
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,dataRefs.cslFixAcIcaoType._M_dataplus._M_p,
             dataRefs.cslFixAcIcaoType._M_dataplus._M_p + dataRefs.cslFixAcIcaoType._M_string_length
            );
  LTFlightData::WaitForSafeCopyStat(&statCopy,inFd);
  plVar12 = local_538;
  paVar2 = &statCopy.acTypeIcao.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)statCopy.acTypeIcao._M_dataplus._M_p == paVar2) {
    local_538[1] = statCopy.acTypeIcao.field_2._8_8_;
    local_548 = plVar12;
  }
  else {
    local_548 = (long *)statCopy.acTypeIcao._M_dataplus._M_p;
  }
  local_540 = statCopy.acTypeIcao._M_string_length;
  statCopy.acTypeIcao._M_string_length = 0;
  statCopy.acTypeIcao.field_2._M_local_buf[0] = '\0';
  local_508._M_len = 2;
  local_508._M_array = &local_568;
  statCopy.acTypeIcao._M_dataplus._M_p = (pointer)paVar2;
  str_first_non_empty(&local_628,&local_508);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,local_628._M_dataplus._M_p,&local_6d9);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,dataRefs.cslFixOpIcao._M_dataplus._M_p,
             dataRefs.cslFixOpIcao._M_dataplus._M_p + dataRefs.cslFixOpIcao._M_string_length);
  LTFlightData::WaitForSafeCopyStat((FDStaticData *)&dynCopy,inFd);
  if (local_1e8 == 0) {
    std::__cxx11::string::substr((ulong)local_588,(ulong)local_288);
  }
  else {
    local_588[0] = local_578;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_588,local_1f0._M_p,local_1f0._M_p + local_1e8);
  }
  local_518._M_len = 2;
  local_518._M_array = &local_5a8;
  str_first_non_empty(&local_668,&local_518);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,local_668._M_dataplus._M_p,&local_6da);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,dataRefs.cslFixLivery._M_dataplus._M_p,
             dataRefs.cslFixLivery._M_dataplus._M_p + dataRefs.cslFixLivery._M_string_length);
  LTFlightData::WaitForSafeCopyStat(&local_1c8,inFd);
  plVar13 = local_5b8;
  paVar2 = &local_1c8.reg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.reg._M_dataplus._M_p == paVar2) {
    local_5b8[1] = local_1c8.reg.field_2._8_8_;
    local_5c8 = plVar13;
  }
  else {
    local_5c8 = (long *)local_1c8.reg._M_dataplus._M_p;
  }
  local_5c0 = local_1c8.reg._M_string_length;
  local_1c8.reg._M_string_length = 0;
  local_1c8.reg.field_2._M_local_buf[0] = '\0';
  local_528._M_len = 2;
  local_528._M_array = &local_5e8;
  local_1c8.reg._M_dataplus._M_p = (pointer)paVar2;
  str_first_non_empty(&local_6a8,&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,local_6a8._M_dataplus._M_p,&local_6db);
  uVar15 = (inFd->acKey).num;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  _modeS_id = (XPMPPlaneID)uVar15;
  if (0xfffffe < uVar15) {
    _modeS_id = 0;
  }
  XPMP2::Aircraft::Aircraft
            (&this->super_Aircraft,&local_608,&local_648,&local_688,_modeS_id,&local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  lVar14 = -0x40;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  LTFlightData::FDStaticData::~FDStaticData(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  lVar14 = -0x40;
  plVar13 = local_578;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&dynCopy);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  lVar14 = -0x40;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  LTFlightData::FDStaticData::~FDStaticData(&statCopy);
  (this->super_Aircraft)._vptr_Aircraft = (_func_int **)&PTR__LTAircraft_002db7a8;
  this->fd = inFd;
  pFVar8 = FlightModel::FindFlightModel(inFd,true,(string **)0x0);
  this->pMdl = pFVar8;
  pDVar9 = Doc8643::get(&(this->super_Aircraft).acIcaoType);
  this->pDoc8643 = pDVar9;
  this->bStaticObject = false;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::_M_initialize_map
            (&(this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>,0);
  local_6d8 = &(this->labelInternal).field_2;
  (this->labelInternal)._M_dataplus._M_p = (pointer)local_6d8;
  (this->labelInternal)._M_string_length = 0;
  (this->labelInternal).field_2._M_local_buf[0] = '\0';
  (this->ppos)._lat = NAN;
  (this->ppos)._lon = NAN;
  (this->ppos)._alt = NAN;
  (this->ppos)._ts = NAN;
  (this->ppos)._head = NAN;
  (this->ppos)._pitch = NAN;
  (this->ppos)._roll = NAN;
  (this->ppos).mergeCount = 1;
  ppVar1 = &(this->ppos).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->ppos).edgeIdx = 0xffffffffffffffff;
  (this->vec).angle = NAN;
  (this->vec).dist = NAN;
  (this->vec).vsi = NAN;
  (this->vec).speed = NAN;
  this->tsLastCalcRequested = 0.0;
  this->phase = FPH_UNKNOWN;
  this->rotateTs = NAN;
  this->vsi = 0.0;
  *(undefined4 *)((long)&this->vsi + 7) = 0;
  (this->speed).startSpeed = NAN;
  (this->speed).targetSpeed = NAN;
  (this->speed).acceleration = NAN;
  (this->speed).targetDeltaDist = NAN;
  (this->speed).startTime = NAN;
  (this->speed).accelStartTime = NAN;
  (this->speed).targetTime = NAN;
  (this->speed).currSpeed_m_s = NAN;
  (this->speed).currSpeed_kt = NAN;
  local_6d0 = &this->posList;
  BezierCurve::BezierCurve(&this->turn);
  pFVar8 = this->pMdl;
  dVar3 = pFVar8->TAXI_TURN_TIME;
  *(undefined4 *)&(this->heading).defMin = 0;
  *(undefined4 *)((long)&(this->heading).defMin + 4) = 0;
  *(undefined4 *)&(this->heading).defMax = 0;
  *(undefined4 *)((long)&(this->heading).defMax + 4) = 0x40768000;
  (this->heading).defDist = 360.0;
  (this->heading).defDuration = dVar3;
  (this->heading).bWrapAround = true;
  (this->heading).valFrom = NAN;
  (this->heading).valTo = NAN;
  (this->heading).valDist = NAN;
  (this->heading).timeFrom = NAN;
  (this->heading).timeTo = NAN;
  (this->heading).bIncrease = true;
  dVar3 = pFVar8->FLIGHT_TURN_TIME;
  *(undefined4 *)&(this->heading).val = 0;
  *(undefined4 *)((long)&(this->heading).val + 4) = 0;
  *(undefined4 *)&(this->corrAngle).defMin = 0;
  *(undefined4 *)((long)&(this->corrAngle).defMin + 4) = 0xc0568000;
  (this->corrAngle).defMax = 90.0;
  (this->corrAngle).defDist = 180.0;
  (this->corrAngle).defDuration = dVar3 * 0.5;
  (this->corrAngle).bWrapAround = false;
  (this->corrAngle).valFrom = NAN;
  (this->corrAngle).valTo = NAN;
  (this->corrAngle).valDist = NAN;
  (this->corrAngle).timeFrom = NAN;
  (this->corrAngle).timeTo = NAN;
  (this->corrAngle).bIncrease = true;
  dVar3 = pFVar8->GEAR_DURATION;
  (this->corrAngle).val = -90.0;
  (this->gear).defMin = 0.0;
  (this->gear).defMax = 1.0;
  (this->gear).defDist = 1.0;
  (this->gear).defDuration = dVar3;
  (this->gear).bWrapAround = false;
  (this->gear).valFrom = NAN;
  (this->gear).valTo = NAN;
  (this->gear).valDist = NAN;
  (this->gear).timeFrom = NAN;
  (this->gear).timeTo = NAN;
  (this->gear).bIncrease = true;
  dVar3 = pFVar8->FLAPS_DURATION;
  (this->gear).val = 0.0;
  (this->flaps).defMin = 0.0;
  (this->flaps).defMax = 1.0;
  (this->flaps).defDist = 1.0;
  (this->flaps).defDuration = dVar3;
  (this->flaps).bWrapAround = false;
  (this->flaps).valFrom = NAN;
  (this->flaps).valTo = NAN;
  (this->flaps).valDist = NAN;
  (this->flaps).timeFrom = NAN;
  (this->flaps).timeTo = NAN;
  (this->flaps).bIncrease = true;
  (this->flaps).val = 0.0;
  MovingParam::MovingParam
            (&this->pitch,(pFVar8->PITCH_MAX - pFVar8->PITCH_MIN) / pFVar8->PITCH_RATE,
             pFVar8->PITCH_MAX,pFVar8->PITCH_MIN,false);
  *(undefined4 *)&(this->reversers).defMin = 0;
  *(undefined4 *)((long)&(this->reversers).defMin + 4) = 0;
  *(undefined4 *)&(this->reversers).defMax = 0;
  *(undefined4 *)((long)&(this->reversers).defMax + 4) = 0x3ff00000;
  (this->reversers).defDist = 1.0;
  (this->reversers).defDuration = 2.0;
  (this->reversers).bWrapAround = false;
  (this->reversers).valFrom = NAN;
  (this->reversers).valTo = NAN;
  (this->reversers).valDist = NAN;
  (this->reversers).timeFrom = NAN;
  (this->reversers).timeTo = NAN;
  (this->reversers).bIncrease = true;
  (this->reversers).val = 0.0;
  (this->spoilers).defMin = 0.0;
  (this->spoilers).defMax = 1.0;
  (this->spoilers).defDist = 1.0;
  (this->spoilers).defDuration = 0.5;
  (this->spoilers).bWrapAround = false;
  (this->spoilers).valFrom = NAN;
  (this->spoilers).valTo = NAN;
  (this->spoilers).valDist = NAN;
  (this->spoilers).timeFrom = NAN;
  (this->spoilers).timeTo = NAN;
  (this->spoilers).bIncrease = true;
  (this->spoilers).val = 0.0;
  (this->tireRpm).defMin = 0.0;
  (this->tireRpm).defMax = 2000.0;
  (this->tireRpm).defDist = 2000.0;
  (this->tireRpm).defDuration = 5.0;
  (this->tireRpm).bWrapAround = false;
  (this->tireRpm).valFrom = NAN;
  (this->tireRpm).valTo = NAN;
  (this->tireRpm).valDist = NAN;
  (this->tireRpm).timeFrom = NAN;
  (this->tireRpm).timeTo = NAN;
  (this->tireRpm).bIncrease = true;
  (this->tireRpm).val = 0.0;
  MovingParam::MovingParam(&this->gearDeflection,0.5,this->pMdl->GEAR_DEFLECTION,0.0,false);
  this->probeNextTs = 0.0;
  this->terrainAlt_m = 0.0;
  *(undefined4 *)&(this->vecView).angle = 0;
  *(undefined4 *)((long)&(this->vecView).angle + 4) = 0x7ff80000;
  *(undefined4 *)&(this->vecView).dist = 0;
  *(undefined4 *)((long)&(this->vecView).dist + 4) = 0x7ff80000;
  *(undefined4 *)&(this->vecView).vsi = 0;
  *(undefined4 *)((long)&(this->vecView).vsi + 4) = 0x7ff80000;
  *(undefined4 *)&(this->vecView).speed = 0;
  *(undefined4 *)((long)&(this->vecView).speed + 4) = 0x7ff80000;
  this->bChangeModel = false;
  this->bSendNewInfoData = false;
  this->bSetVisible = true;
  this->bAutoVisible = true;
  (this->nearestAirport)._M_dataplus._M_p = (pointer)&(this->nearestAirport).field_2;
  (this->nearestAirport)._M_string_length = 0;
  (this->nearestAirport).field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&(this->nearestAirportPos)._lat = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._lat + 4) = 0x7ff80000;
  *(undefined4 *)&(this->nearestAirportPos)._lon = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._lon + 4) = 0x7ff80000;
  *(undefined4 *)&(this->nearestAirportPos)._alt = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._alt + 4) = 0x7ff80000;
  *(undefined4 *)&(this->nearestAirportPos)._ts = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._ts + 4) = 0x7ff80000;
  *(undefined4 *)&(this->nearestAirportPos)._head = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._head + 4) = 0x7ff80000;
  *(undefined4 *)&(this->nearestAirportPos)._pitch = 0;
  *(undefined4 *)((long)&(this->nearestAirportPos)._pitch + 4) = 0x7ff80000;
  (this->nearestAirportPos)._roll = NAN;
  (this->nearestAirportPos).mergeCount = 1;
  ppVar1 = &(this->nearestAirportPos).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->nearestAirportPos).edgeIdx = 0xffffffffffffffff;
  this->lastNearestAirportCheck = 0.0;
  iVar7 = XPLMGetCycleNumber();
  if (iVar7 != currCycle.num) {
    NextCycle(iVar7);
  }
  __mutex = &this->fd->dataAccessMutex;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 == 0) {
    LTFlightData::WaitForSafeCopyDyn(&dynCopy,this->fd,true);
    LTFlightData::WaitForSafeCopyStat(&statCopy,this->fd);
    bVar6 = LTFlightData::FDStaticData::isStaticObject(&statCopy);
    this->bStaticObject = bVar6;
    (this->super_Aircraft).aiPrio = 0;
    (this->super_Aircraft).bClampToGround = false;
    (this->super_Aircraft).acRadar.size = dynCopy.radar.size;
    (this->super_Aircraft).acRadar.code = dynCopy.radar.code;
    (this->super_Aircraft).acRadar.mode = dynCopy.radar.mode;
    LabelUpdate(this);
    CalcLabelInternal(this,&statCopy);
    dVar3 = (this->pitch).defMin;
    dVar4 = (this->pitch).defMax;
    uVar16 = SUB84(dVar4,0);
    uVar17 = (undefined4)((ulong)dVar4 >> 0x20);
    if (0.0 <= dVar4) {
      uVar16 = 0;
      uVar17 = 0;
    }
    uVar15 = -(ulong)(0.0 < dVar3);
    (this->pitch).val = (double)(uVar15 & (ulong)dVar3 | ~uVar15 & CONCAT44(uVar17,uVar16));
    (this->pitch).timeTo = NAN;
    (this->pitch).valDist = NAN;
    (this->pitch).timeFrom = NAN;
    (this->pitch).valFrom = NAN;
    (this->pitch).valTo = NAN;
    dVar3 = (this->corrAngle).defMin;
    dVar4 = (this->corrAngle).defMax;
    uVar16 = SUB84(dVar4,0);
    uVar17 = (undefined4)((ulong)dVar4 >> 0x20);
    if (0.0 <= dVar4) {
      uVar16 = 0;
      uVar17 = 0;
    }
    uVar15 = -(ulong)(0.0 < dVar3);
    (this->corrAngle).val = (double)(uVar15 & (ulong)dVar3 | ~uVar15 & CONCAT44(uVar17,uVar16));
    (this->corrAngle).timeTo = NAN;
    (this->corrAngle).valDist = NAN;
    (this->corrAngle).timeFrom = NAN;
    (this->corrAngle).valFrom = NAN;
    (this->corrAngle).valTo = NAN;
    bVar6 = CalcPPos(this);
    if (!bVar6 && (int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x514,"LTAircraft",logERR,"Could not calculate position when creating aircraft %s",
             (this->fd->acKey).key._M_dataplus._M_p);
    }
    if ((this->super_Aircraft).bOnGrnd == true) {
      dVar3 = (this->gear).defMin;
      uVar16 = SUB84(dVar3,0);
      uVar17 = (undefined4)((ulong)dVar3 >> 0x20);
      dVar4 = (this->gear).defMax;
      if (dVar3 <= dVar4) {
        uVar16 = SUB84(dVar4,0);
        uVar17 = (undefined4)((ulong)dVar4 >> 0x20);
      }
      (this->gear).val = (double)CONCAT44(uVar17,uVar16);
      (this->gear).timeTo = NAN;
      (this->gear).valDist = NAN;
      (this->gear).timeFrom = NAN;
      (this->gear).valFrom = NAN;
      (this->gear).valTo = NAN;
      dVar3 = (this->gearDeflection).defMin;
      dVar4 = (this->gearDeflection).defMax;
      dVar18 = (dVar3 + dVar4) * 0.5;
      if (dVar18 <= dVar4) {
        dVar4 = dVar18;
      }
      (this->gearDeflection).val =
           (double)(-(ulong)(dVar18 < dVar3) & (ulong)dVar3 |
                   ~-(ulong)(dVar18 < dVar3) & (ulong)dVar4);
      (this->gearDeflection).timeTo = NAN;
      (this->gearDeflection).valDist = NAN;
      (this->gearDeflection).timeFrom = NAN;
      (this->gearDeflection).valFrom = NAN;
      (this->gearDeflection).valTo = NAN;
    }
    DataRefs::IncNumAc(&dataRefs);
    if ((int)dataRefs.iLogLevel < 2) {
      pcVar5 = (this->labelInternal)._M_dataplus._M_p;
      psVar10 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
      if (dynCopy.pChannel == (LTChannel *)0x0) {
        pcVar11 = "?";
      }
      else {
        pcVar11 = (dynCopy.pChannel)->pszChName;
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x524,"LTAircraft",logINFO,
             "Added aircraft %s, operator \'%s\', a/c model \'%s\', flight model [%s], bearing %.0f, distance %.1fnm, from channel %s"
             ,SUB84((this->vecView).angle,0),SUB84((this->vecView).dist / 1852.0,0),pcVar5,
             statCopy.opIcao._M_dataplus._M_p,(psVar10->_M_dataplus)._M_p,
             (this->pMdl->modelName)._M_dataplus._M_p,pcVar11);
    }
    LTFlightData::FDStaticData::~FDStaticData(&statCopy);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

LTAircraft::LTAircraft(LTFlightData& inFd) :
// Base class -> this registers with XPMP API for actual display in XP!
// repeated calls to WaitForSafeCopyStat look inefficient, but if the lock is held by the calling function already then these are quick recursive calls
// Using registration as livery indicator, allows for different liveries per actual airframe
// Debug options to set fixed type/op/livery take precedence
XPMP2::Aircraft(str_first_non_empty({dataRefs.cslFixAcIcaoType, inFd.WaitForSafeCopyStat().acTypeIcao}).c_str(),
                str_first_non_empty({dataRefs.cslFixOpIcao,     inFd.WaitForSafeCopyStat().airlineCode()}).c_str(),
                str_first_non_empty({dataRefs.cslFixLivery,     inFd.WaitForSafeCopyStat().reg}).c_str(),
                inFd.key().num < MAX_MODE_S_ID ? (XPMPPlaneID)inFd.key().num : 0),      // OGN Ids can be larger than MAX_MODE_S_ID, in that case let XPMP2 assign a synthetic id
// class members
fd(inFd),
pMdl(&FlightModel::FindFlightModel(inFd, true)),      // find matching flight model
pDoc8643(&Doc8643::get(acIcaoType)),
tsLastCalcRequested(0),
phase(FPH_UNKNOWN),
rotateTs(NAN),
vsi(0.0),
bArtificalPos(false),
heading(pMdl->TAXI_TURN_TIME, 360, 0, true),
corrAngle(pMdl->FLIGHT_TURN_TIME / 2.0, 90, -90, false),
gear(pMdl->GEAR_DURATION),
flaps(pMdl->FLAPS_DURATION),
pitch((pMdl->PITCH_MAX-pMdl->PITCH_MIN)/pMdl->PITCH_RATE, pMdl->PITCH_MAX, pMdl->PITCH_MIN),
reversers(MDL_REVERSERS_TIME),
spoilers(MDL_SPOILERS_TIME),
tireRpm(MDL_TIRE_SLOW_TIME, MDL_TIRE_MAX_RPM),
gearDeflection(MDL_GEAR_DEFL_TIME, pMdl->GEAR_DEFLECTION),
probeNextTs(0), terrainAlt_m(0.0)
{
    // for some calcs we need correct timestamps _before_ first draw already
    // so make sure the currCycle struct is up-to-date
    int cycle = XPLMGetCycleNumber();
    if ( cycle != currCycle.num )            // new cycle!
        NextCycle(cycle);

    try {
        // access guarded by a mutex (will be a recursive call: creator/caller should be holding the lock already)
        std::lock_guard<std::recursive_mutex> lock (fd.dataAccessMutex);
        
        // get copy of dynamice and static data for constructor purposes
        LTFlightData::FDDynamicData dynCopy (fd.WaitForSafeCopyDyn());
        LTFlightData::FDStaticData statCopy (fd.WaitForSafeCopyStat());
        bStaticObject = statCopy.isStaticObject();
        
        // init
        aiPrio = 0;
        bClampToGround = false;
        
        // positional data / radar: just copy from fd for a start
        acRadar = dynCopy.radar;

        // standard label
        LabelUpdate();

        // standard internal label (e.g. for logging) is transpIcao + ac type + another id if available
        CalcLabelInternal(statCopy);
        
        // init moving params where necessary
        pitch.SetVal(0);
        corrAngle.SetVal(0);
        
        // calculate our first position, must also succeed
        if (!CalcPPos())
            LOG_MSG(logERR,ERR_AC_CALC_PPOS,fd.key().c_str());
        
        // if we start on the ground then have the gear out already
        if (IsOnGrnd()) {
            gear.SetVal(gear.defMax);
            gearDeflection.SetVal((gearDeflection.defMin+gearDeflection.defMax)/2);
        }
        
        // tell the world we've added something
        dataRefs.IncNumAc();
        LOG_MSG(logINFO,INFO_AC_ADDED,
                labelInternal.c_str(),
                statCopy.opIcao.c_str(),
                GetModelName().c_str(),
                pMdl->modelName.c_str(),
                vecView.angle, vecView.dist/M_per_NM,
                dynCopy.pChannel ? dynCopy.pChannel->ChName() : "?");
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}